

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void er_draw(vector<cv::Mat,_std::allocator<cv::Mat>_> *channels,
            vector<std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>,_std::allocator<std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>_>_>
            *regions,vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_> *group,
            Mat *segmentation)

{
  int iVar1;
  int iVar2;
  int iVar3;
  vector<std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>,_std::allocator<std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>_>_>
  *this;
  vector<cv::Mat,_std::allocator<cv::Mat>_> *pvVar4;
  size_type sVar5;
  reference pvVar6;
  int *piVar7;
  reference this_00;
  reference pvVar8;
  vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_> *in_RDX;
  vector<std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>,_std::allocator<std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>_>_>
  *in_RSI;
  vector<cv::Mat,_std::allocator<cv::Mat>_> *in_RDI;
  int flags;
  int newMaskVal;
  ERStat er;
  int r;
  ERStat *in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe04;
  undefined1 local_190 [104];
  undefined1 local_128 [40];
  undefined1 local_100 [24];
  undefined4 local_e8;
  undefined4 local_e4;
  int local_e0;
  long local_60;
  int local_24;
  vector<std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>,_std::allocator<std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>_>_>
  *local_10;
  vector<cv::Mat,_std::allocator<cv::Mat>_> *local_8;
  
  local_24 = 0;
  local_10 = in_RSI;
  local_8 = in_RDI;
  while( true ) {
    iVar1 = local_24;
    sVar5 = std::vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>::size(in_RDX);
    this = local_10;
    if ((int)sVar5 <= iVar1) break;
    pvVar6 = std::vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>::operator[]
                       (in_RDX,(long)local_24);
    piVar7 = cv::Vec<int,_2>::operator[](pvVar6,0);
    this_00 = std::
              vector<std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>,_std::allocator<std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>_>_>
              ::operator[](this,(long)*piVar7);
    pvVar6 = std::vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>::operator[]
                       (in_RDX,(long)local_24);
    piVar7 = cv::Vec<int,_2>::operator[](pvVar6,1);
    std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>::operator[]
              (this_00,(long)*piVar7);
    cv::text::ERStat::ERStat
              ((ERStat *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
               in_stack_fffffffffffffdf8);
    pvVar4 = local_8;
    if (local_60 != 0) {
      local_e4 = 0xff;
      local_e8 = 0x3ff04;
      pvVar6 = std::vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>::operator[]
                         (in_RDX,(long)local_24);
      piVar7 = cv::Vec<int,_2>::operator[](pvVar6,0);
      std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[](pvVar4,(long)*piVar7);
      cv::_InputOutputArray::_InputOutputArray
                ((_InputOutputArray *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                 (Mat *)in_stack_fffffffffffffdf8);
      cv::_InputOutputArray::_InputOutputArray
                ((_InputOutputArray *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                 (Mat *)in_stack_fffffffffffffdf8);
      pvVar4 = local_8;
      iVar2 = local_e0;
      pvVar6 = std::vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>::operator[]
                         (in_RDX,(long)local_24);
      piVar7 = cv::Vec<int,_2>::operator[](pvVar6,0);
      pvVar8 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[](pvVar4,(long)*piVar7);
      pvVar4 = local_8;
      iVar3 = local_e0;
      iVar1 = *(int *)(pvVar8 + 0xc);
      pvVar6 = std::vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>::operator[]
                         (in_RDX,(long)local_24);
      piVar7 = cv::Vec<int,_2>::operator[](pvVar6,0);
      pvVar8 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[](pvVar4,(long)*piVar7);
      cv::Point_<int>::Point_
                ((Point_<int> *)(local_190 + 0x60),iVar2 % iVar1,iVar3 / *(int *)(pvVar8 + 0xc));
      cv::Scalar_<double>::Scalar_
                ((Scalar_<double> *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                 (double)in_stack_fffffffffffffdf8);
      cv::Scalar_<double>::Scalar_
                ((Scalar_<double> *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                 (double)in_stack_fffffffffffffdf8);
      cv::Scalar_<double>::Scalar_
                ((Scalar_<double> *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                 (double)in_stack_fffffffffffffdf8);
      in_stack_fffffffffffffdf8 = (ERStat *)local_190;
      in_stack_fffffffffffffe00 = local_e8;
      cv::floodFill(local_100,local_128,local_190 + 0x60,local_190 + 0x40,0,local_190 + 0x20);
      cv::_InputOutputArray::~_InputOutputArray((_InputOutputArray *)0x113cbe);
      cv::_InputOutputArray::~_InputOutputArray((_InputOutputArray *)0x113ccb);
    }
    cv::text::ERStat::~ERStat((ERStat *)0x113d36);
    local_24 = local_24 + 1;
  }
  return;
}

Assistant:

void er_draw(vector<Mat> &channels, vector<vector<ERStat> > &regions, vector<Vec2i> group, Mat& segmentation)
{
    for (int r=0; r<(int)group.size(); r++)
    {
        ERStat er = regions[group[r][0]][group[r][1]];
        if (er.parent != NULL) // deprecate the root region
        {
            int newMaskVal = 255;
            int flags = 4 + (newMaskVal << 8) + FLOODFILL_FIXED_RANGE + FLOODFILL_MASK_ONLY;
            floodFill(channels[group[r][0]],segmentation,Point(er.pixel%channels[group[r][0]].cols,er.pixel/channels[group[r][0]].cols),
                      Scalar(255),0,Scalar(er.level),Scalar(0),flags);
        }
    }
}